

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::Prog::ConfigurePrefixAccel(Prog *this,string *prefix,bool prefix_foldcase)

{
  size_type sVar1;
  unsigned_long *puVar2;
  uint64_t *puVar3;
  const_reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  string *psStack_18;
  bool prefix_foldcase_local;
  string *prefix_local;
  Prog *this_local;
  
  this->prefix_foldcase_ = prefix_foldcase;
  local_19 = prefix_foldcase;
  psStack_18 = prefix;
  prefix_local = (string *)this;
  sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prefix);
  this->prefix_size_ = sVar1;
  if ((this->prefix_foldcase_ & 1U) == 0) {
    if (this->prefix_size_ == 1) {
      pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       psStack_18);
      *(int *)&this->field_11 = (int)*pvVar4;
    }
    else {
      pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       psStack_18);
      *(int *)&this->field_11 = (int)*pvVar4;
      pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      psStack_18);
      *(int *)((long)&this->field_11 + 4) = (int)*pvVar4;
    }
  }
  else {
    puVar2 = CLI::std::min<unsigned_long>(&this->prefix_size_,&kShiftDFAFinal);
    this->prefix_size_ = *puVar2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psStack_18,0,
               this->prefix_size_);
    puVar3 = BuildShiftDFA((string *)&local_40);
    (this->field_11).prefix_dfa_ = puVar3;
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void Prog::ConfigurePrefixAccel(const std::string& prefix,
                                bool prefix_foldcase) {
  prefix_foldcase_ = prefix_foldcase;
  prefix_size_ = prefix.size();
  if (prefix_foldcase_) {
    // Use PrefixAccel_ShiftDFA().
    // ... and no more than nine bytes of the prefix. (See above for details.)
    prefix_size_ = std::min(prefix_size_, kShiftDFAFinal);
    prefix_dfa_ = BuildShiftDFA(prefix.substr(0, prefix_size_));
  } else if (prefix_size_ != 1) {
    // Use PrefixAccel_FrontAndBack().
    prefix_front_ = prefix.front();
    prefix_back_ = prefix.back();
  } else {
    // Use memchr(3).
    prefix_front_ = prefix.front();
  }
}